

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doh.c
# Opt level: O3

void Curl_doh_cleanup(Curl_easy *data)

{
  doh_probes *pdVar1;
  
  pdVar1 = (data->req).doh;
  if (pdVar1 != (doh_probes *)0x0) {
    Curl_doh_close(data);
    curl_slist_free_all(pdVar1->req_hds);
    pdVar1 = (data->req).doh;
    pdVar1->req_hds = (curl_slist *)0x0;
    (*Curl_cfree)(pdVar1);
    (data->req).doh = (doh_probes *)0x0;
  }
  return;
}

Assistant:

void Curl_doh_cleanup(struct Curl_easy *data)
{
  struct doh_probes *doh = data->req.doh;
  if(doh) {
    Curl_doh_close(data);
    curl_slist_free_all(doh->req_hds);
    data->req.doh->req_hds = NULL;
    Curl_safefree(data->req.doh);
  }
}